

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O2

void __thiscall KDReports::ImageElement::setPixmap(ImageElement *this,QPixmap *pixmap)

{
  QSize QVar1;
  QImage local_50 [24];
  enable_if_t<std::is_copy_constructible_v<QImage>,_QVariant> local_38;
  
  QPixmap::toImage();
  QVariant::fromValue<QImage>(&local_38,local_50);
  QVariant::operator=(&((this->d)._M_t.
                        super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
                        .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl
                       )->m_pixmap,&local_38);
  QVariant::~QVariant(&local_38);
  QImage::~QImage(local_50);
  QVar1 = (QSize)QPixmap::size();
  ((this->d)._M_t.
   super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
   ._M_t.
   super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
   .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl)->m_pixmapSize =
       QVar1;
  return;
}

Assistant:

void KDReports::ImageElement::setPixmap(const QPixmap &pixmap)
{
    // the call to toImage() is a workaround for a bug in QTextOdfWriter
    // https://codereview.qt-project.org/c/qt/qtbase/+/369642
    d->m_pixmap = QVariant::fromValue(pixmap.toImage());
    d->m_pixmapSize = pixmap.size();
}